

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateMacro(WriteAheadLogDeserializer *this)

{
  ClientContext *context;
  Catalog *this_00;
  CreateInfo *in_RAX;
  CreateFunctionInfo *info;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(short)this + 0x58,(char *)0x65);
  if (this->deserialize_only == false) {
    context = this->context;
    this_00 = this->catalog;
    info = (CreateFunctionInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&stack0xffffffffffffffe8);
    Catalog::CreateFunction(this_00,context,info);
  }
  if ((__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
      local_18._M_head_impl !=
      (__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)0x0) {
    (**(code **)(*(_func_int **)local_18._M_head_impl + 8))();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateMacro() {
	auto entry = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "macro");
	if (DeserializeOnly()) {
		return;
	}

	catalog.CreateFunction(context, entry->Cast<CreateMacroInfo>());
}